

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_ssse3.c
# Opt level: O3

void av1_highbd_convolve_y_sr_ssse3
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  undefined4 *puVar1;
  undefined2 *puVar2;
  undefined2 *puVar3;
  undefined2 *puVar4;
  uint16_t *puVar5;
  int16_t *piVar6;
  undefined1 (*pauVar7) [16];
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint16_t *puVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint16_t *puVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  short sVar23;
  undefined4 uVar24;
  undefined4 uVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar29;
  ushort uVar30;
  ushort uVar40;
  undefined4 uVar31;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ushort uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined4 uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined4 uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 local_228 [16];
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  short sStack_170;
  short sStack_16e;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_108 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar52 [16];
  undefined1 auVar62 [16];
  undefined1 auVar53 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar54 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar93 [16];
  undefined1 auVar96 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar114 [16];
  undefined1 auVar118 [16];
  
  uVar30 = filter_params_y->taps;
  lVar14 = (long)(int)(((uVar30 >> 1) - 1) * src_stride);
  uVar15 = 0xff;
  if (bd == 0xc) {
    uVar15 = 0xfff;
  }
  uVar18 = 0x3ff;
  if (bd != 10) {
    uVar18 = uVar15;
  }
  auVar25 = pshuflw(ZEXT416(uVar18),ZEXT416(uVar18),0);
  sStack_170 = auVar25._0_2_;
  sStack_16e = auVar25._2_2_;
  if (uVar30 == 0xc) {
    if (0 < w) {
      uVar22 = (ulong)((subpel_y_qn & 0xfU) * 0x18);
      uVar8 = *(undefined8 *)((long)filter_params_y->filter_ptr + uVar22 + 0x10);
      puVar1 = (undefined4 *)((long)filter_params_y->filter_ptr + uVar22);
      uVar24 = *puVar1;
      uVar89 = puVar1[1];
      uVar28 = puVar1[2];
      uVar31 = puVar1[3];
      auVar74._4_4_ = uVar24;
      auVar74._0_4_ = uVar24;
      auVar74._8_4_ = uVar24;
      auVar74._12_4_ = uVar24;
      auVar66._4_4_ = uVar28;
      auVar66._0_4_ = uVar28;
      auVar66._8_4_ = uVar28;
      auVar66._12_4_ = uVar28;
      auVar98._4_4_ = uVar31;
      auVar98._0_4_ = uVar31;
      auVar98._8_4_ = uVar31;
      auVar98._12_4_ = uVar31;
      uVar24 = (undefined4)uVar8;
      uVar28 = (undefined4)((ulong)uVar8 >> 0x20);
      lVar21 = (long)dst_stride;
      lVar20 = (long)(src_stride * 0xc) * 2 + lVar14 * -2;
      lVar16 = (long)(src_stride * 0xb) * 2 + lVar14 * -2;
      uVar22 = 0;
      do {
        if (0 < h) {
          pauVar7 = (undefined1 (*) [16])(src + (uVar22 - lVar14));
          puVar2 = (undefined2 *)(*pauVar7 + (long)(src_stride * 7) * 2);
          puVar3 = (undefined2 *)(*pauVar7 + (long)(src_stride * 5) * 2);
          auVar25 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 6) * 2);
          auVar48 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 3) * 2);
          auVar97 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 4) * 2);
          puVar4 = (undefined2 *)(*pauVar7 + (long)src_stride * 2);
          local_218 = puVar4[4];
          uStack_214 = puVar4[5];
          uStack_210 = puVar4[6];
          uStack_20c = puVar4[7];
          auVar81 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 2) * 2);
          auVar75 = *pauVar7;
          local_138._2_2_ = local_218;
          local_138._0_2_ = auVar75._8_2_;
          local_138._4_2_ = auVar75._10_2_;
          local_138._6_2_ = uStack_214;
          local_138._8_2_ = auVar75._12_2_;
          local_138._10_2_ = uStack_210;
          local_138._12_2_ = auVar75._14_2_;
          local_138._14_2_ = uStack_20c;
          auVar35._0_12_ = auVar75._0_12_;
          auVar35._12_2_ = auVar75._6_2_;
          auVar35._14_2_ = puVar4[3];
          auVar34._12_4_ = auVar35._12_4_;
          auVar34._0_10_ = auVar75._0_10_;
          auVar34._10_2_ = puVar4[2];
          auVar33._10_6_ = auVar34._10_6_;
          auVar33._0_8_ = auVar75._0_8_;
          auVar33._8_2_ = auVar75._4_2_;
          auVar32._8_8_ = auVar33._8_8_;
          auVar32._6_2_ = puVar4[1];
          auVar32._4_2_ = auVar75._2_2_;
          auVar32._0_2_ = auVar75._0_2_;
          auVar32._2_2_ = *puVar4;
          uStack_216 = auVar81._8_2_;
          uStack_212 = auVar81._10_2_;
          uStack_20e = auVar81._12_2_;
          uStack_20a = auVar81._14_2_;
          auVar105._0_2_ = auVar81._0_2_;
          local_1f8._2_2_ = auVar105._0_2_;
          local_1f8._0_2_ = *puVar4;
          local_1f8._4_2_ = puVar4[1];
          local_1f8._6_2_ = auVar81._2_2_;
          local_1f8._8_2_ = puVar4[2];
          local_1f8._10_2_ = auVar81._4_2_;
          local_1f8._12_2_ = puVar4[3];
          local_1f8._14_2_ = auVar81._6_2_;
          auVar50._2_2_ = auVar48._8_2_;
          auVar50._0_2_ = uStack_216;
          auVar50._4_2_ = uStack_212;
          auVar50._6_2_ = auVar48._10_2_;
          auVar50._8_2_ = uStack_20e;
          auVar50._10_2_ = auVar48._12_2_;
          auVar50._12_2_ = uStack_20a;
          auVar50._14_2_ = auVar48._14_2_;
          auVar108._0_12_ = auVar81._0_12_;
          auVar108._12_2_ = auVar81._6_2_;
          auVar108._14_2_ = auVar48._6_2_;
          auVar107._12_4_ = auVar108._12_4_;
          auVar107._0_10_ = auVar81._0_10_;
          auVar107._10_2_ = auVar48._4_2_;
          auVar106._10_6_ = auVar107._10_6_;
          auVar106._0_8_ = auVar81._0_8_;
          auVar106._8_2_ = auVar81._4_2_;
          auVar105._8_8_ = auVar106._8_8_;
          auVar105._6_2_ = auVar48._2_2_;
          auVar105._4_2_ = auVar81._2_2_;
          auVar105._2_2_ = auVar48._0_2_;
          local_228._2_2_ = auVar97._8_2_;
          local_228._0_2_ = auVar48._8_2_;
          local_228._4_2_ = auVar48._10_2_;
          local_228._6_2_ = auVar97._10_2_;
          local_228._8_2_ = auVar48._12_2_;
          local_228._10_2_ = auVar97._12_2_;
          local_228._12_2_ = auVar48._14_2_;
          local_228._14_2_ = auVar97._14_2_;
          auVar114._0_12_ = auVar48._0_12_;
          auVar114._12_2_ = auVar48._6_2_;
          auVar114._14_2_ = auVar97._6_2_;
          auVar113._12_4_ = auVar114._12_4_;
          auVar113._0_10_ = auVar48._0_10_;
          auVar113._10_2_ = auVar97._4_2_;
          auVar112._10_6_ = auVar113._10_6_;
          auVar112._0_8_ = auVar48._0_8_;
          auVar112._8_2_ = auVar48._4_2_;
          auVar111._8_8_ = auVar112._8_8_;
          auVar111._6_2_ = auVar97._2_2_;
          auVar111._4_2_ = auVar48._2_2_;
          auVar90._0_2_ = auVar97._0_2_;
          auVar111._2_2_ = auVar90._0_2_;
          auVar111._0_2_ = auVar48._0_2_;
          auVar80._2_2_ = puVar3[4];
          auVar80._0_2_ = auVar97._8_2_;
          auVar80._4_2_ = auVar97._10_2_;
          auVar80._6_2_ = puVar3[5];
          auVar80._8_2_ = auVar97._12_2_;
          auVar80._10_2_ = puVar3[6];
          auVar80._12_2_ = auVar97._14_2_;
          auVar80._14_2_ = puVar3[7];
          auVar93._0_12_ = auVar97._0_12_;
          auVar93._12_2_ = auVar97._6_2_;
          auVar93._14_2_ = puVar3[3];
          auVar92._12_4_ = auVar93._12_4_;
          auVar92._0_10_ = auVar97._0_10_;
          auVar92._10_2_ = puVar3[2];
          auVar91._10_6_ = auVar92._10_6_;
          auVar91._0_8_ = auVar97._0_8_;
          auVar91._8_2_ = auVar97._4_2_;
          auVar90._8_8_ = auVar91._8_8_;
          auVar90._6_2_ = puVar3[1];
          auVar90._4_2_ = auVar97._2_2_;
          auVar90._2_2_ = *puVar3;
          local_1e8._2_2_ = auVar25._8_2_;
          local_1e8._0_2_ = puVar3[4];
          local_1e8._4_2_ = puVar3[5];
          local_1e8._6_2_ = auVar25._10_2_;
          local_1e8._8_2_ = puVar3[6];
          local_1e8._10_2_ = auVar25._12_2_;
          local_1e8._12_2_ = puVar3[7];
          local_1e8._14_2_ = auVar25._14_2_;
          auVar100._0_2_ = auVar25._0_2_;
          local_208._2_2_ = auVar100._0_2_;
          local_208._0_2_ = *puVar3;
          local_208._4_2_ = puVar3[1];
          local_208._6_2_ = auVar25._2_2_;
          local_208._8_2_ = puVar3[2];
          local_208._10_2_ = auVar25._4_2_;
          local_208._12_2_ = puVar3[3];
          local_208._14_2_ = auVar25._6_2_;
          local_1a8._2_2_ = puVar2[4];
          local_1a8._0_2_ = auVar25._8_2_;
          local_1a8._4_2_ = auVar25._10_2_;
          local_1a8._6_2_ = puVar2[5];
          local_1a8._8_2_ = auVar25._12_2_;
          local_1a8._10_2_ = puVar2[6];
          local_1a8._12_2_ = auVar25._14_2_;
          local_1a8._14_2_ = puVar2[7];
          auVar103._0_12_ = auVar25._0_12_;
          auVar103._12_2_ = auVar25._6_2_;
          auVar103._14_2_ = puVar2[3];
          auVar102._12_4_ = auVar103._12_4_;
          auVar102._0_10_ = auVar25._0_10_;
          auVar102._10_2_ = puVar2[2];
          auVar101._10_6_ = auVar102._10_6_;
          auVar101._0_8_ = auVar25._0_8_;
          auVar101._8_2_ = auVar25._4_2_;
          auVar100._8_8_ = auVar101._8_8_;
          auVar100._6_2_ = puVar2[1];
          auVar100._4_2_ = auVar25._2_2_;
          auVar100._2_2_ = *puVar2;
          puVar3 = (undefined2 *)(*pauVar7 + (long)(src_stride * 8) * 2);
          auVar26._2_2_ = puVar3[4];
          auVar26._0_2_ = puVar2[4];
          auVar26._4_2_ = puVar2[5];
          auVar26._6_2_ = puVar3[5];
          auVar26._8_2_ = puVar2[6];
          auVar26._10_2_ = puVar3[6];
          auVar26._12_2_ = puVar2[7];
          auVar26._14_2_ = puVar3[7];
          local_1b8._2_2_ = *puVar3;
          local_1b8._0_2_ = *puVar2;
          local_1b8._4_2_ = puVar2[1];
          local_1b8._6_2_ = puVar3[1];
          local_1b8._8_2_ = puVar2[2];
          local_1b8._10_2_ = puVar3[2];
          local_1b8._12_2_ = puVar2[3];
          local_1b8._14_2_ = puVar3[3];
          puVar2 = (undefined2 *)(*pauVar7 + (long)(src_stride * 9) * 2);
          local_148._2_2_ = puVar2[4];
          local_148._0_2_ = puVar3[4];
          local_148._4_2_ = puVar3[5];
          local_148._6_2_ = puVar2[5];
          local_148._8_2_ = puVar3[6];
          local_148._10_2_ = puVar2[6];
          local_148._12_2_ = puVar3[7];
          local_148._14_2_ = puVar2[7];
          local_168._2_2_ = *puVar2;
          local_168._0_2_ = *puVar3;
          local_168._4_2_ = puVar3[1];
          local_168._6_2_ = puVar2[1];
          local_168._8_2_ = puVar3[2];
          local_168._10_2_ = puVar2[2];
          local_168._12_2_ = puVar3[3];
          local_168._14_2_ = puVar2[3];
          auVar25 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 10) * 2);
          auVar120._2_2_ = auVar25._8_2_;
          auVar120._0_2_ = puVar2[4];
          auVar120._4_2_ = puVar2[5];
          auVar120._6_2_ = auVar25._10_2_;
          auVar120._8_2_ = puVar2[6];
          auVar120._10_2_ = auVar25._12_2_;
          auVar120._12_2_ = puVar2[7];
          auVar120._14_2_ = auVar25._14_2_;
          local_158._2_2_ = auVar25._0_2_;
          local_158._0_2_ = *puVar2;
          local_158._4_2_ = puVar2[1];
          local_158._6_2_ = auVar25._2_2_;
          local_158._8_2_ = puVar2[2];
          local_158._10_2_ = auVar25._4_2_;
          local_158._12_2_ = puVar2[3];
          local_158._14_2_ = auVar25._6_2_;
          lVar19 = 0;
          puVar13 = src;
          puVar17 = dst;
          do {
            auVar79 = auVar111;
            auVar77 = auVar90;
            auVar78 = auVar50;
            auVar27 = auVar26;
            auVar75 = local_228;
            auVar36 = pmaddwd(auVar32,auVar74);
            auVar10._4_4_ = uVar89;
            auVar10._0_4_ = uVar89;
            auVar10._8_4_ = uVar89;
            auVar10._12_4_ = uVar89;
            auVar47 = pmaddwd(auVar105,auVar10);
            auVar37 = pmaddwd(auVar77,auVar66);
            auVar67 = pmaddwd(auVar100,auVar98);
            auVar9._4_4_ = uVar24;
            auVar9._0_4_ = uVar24;
            auVar9._8_4_ = uVar24;
            auVar9._12_4_ = uVar24;
            auVar38 = pmaddwd(local_168,auVar9);
            auVar12._2_2_ = uStack_216;
            auVar12._0_2_ = local_218;
            auVar12._4_2_ = uStack_214;
            auVar12._6_2_ = uStack_212;
            auVar12._10_2_ = uStack_20e;
            auVar12._8_2_ = uStack_210;
            auVar12._12_2_ = uStack_20c;
            auVar12._14_2_ = uStack_20a;
            local_218 = local_228._0_2_;
            uStack_216 = local_228._2_2_;
            uStack_214 = local_228._4_2_;
            uStack_212 = local_228._6_2_;
            uStack_210 = local_228._8_2_;
            uStack_20e = local_228._10_2_;
            uStack_20c = local_228._12_2_;
            uStack_20a = local_228._14_2_;
            local_228 = local_1e8;
            auVar48 = *(undefined1 (*) [16])((long)puVar13 + lVar16);
            auVar54._0_12_ = auVar25._0_12_;
            auVar54._12_2_ = auVar25._6_2_;
            auVar54._14_2_ = auVar48._6_2_;
            auVar53._12_4_ = auVar54._12_4_;
            auVar53._0_10_ = auVar25._0_10_;
            auVar53._10_2_ = auVar48._4_2_;
            auVar52._10_6_ = auVar53._10_6_;
            auVar52._0_8_ = auVar25._0_8_;
            auVar52._8_2_ = auVar25._4_2_;
            auVar51._8_8_ = auVar52._8_8_;
            auVar51._6_2_ = auVar48._2_2_;
            auVar51._4_2_ = auVar25._2_2_;
            auVar51._0_2_ = auVar25._0_2_;
            auVar51._2_2_ = auVar48._0_2_;
            auVar11._4_4_ = uVar28;
            auVar11._0_4_ = uVar28;
            auVar11._8_4_ = uVar28;
            auVar11._12_4_ = uVar28;
            auVar55 = pmaddwd(auVar51,auVar11);
            auVar56 = pmaddwd(local_1f8,auVar74);
            auVar68 = pmaddwd(auVar79,auVar10);
            auVar97 = local_1b8;
            auVar57 = pmaddwd(local_208,auVar66);
            auVar115 = pmaddwd(local_1b8,auVar98);
            local_1b8 = local_158;
            auVar69 = pmaddwd(local_158,auVar9);
            auVar81 = *(undefined1 (*) [16])((long)puVar13 + lVar20);
            auVar118._0_12_ = auVar48._0_12_;
            auVar118._12_2_ = auVar48._6_2_;
            auVar118._14_2_ = auVar81._6_2_;
            auVar117._12_4_ = auVar118._12_4_;
            auVar117._0_10_ = auVar48._0_10_;
            auVar117._10_2_ = auVar81._4_2_;
            auVar116._10_6_ = auVar117._10_6_;
            auVar116._0_8_ = auVar48._0_8_;
            auVar116._8_2_ = auVar48._4_2_;
            local_158._8_8_ = auVar116._8_8_;
            local_158._6_2_ = auVar81._2_2_;
            local_158._4_2_ = auVar48._2_2_;
            local_158._2_2_ = auVar81._0_2_;
            local_158._0_2_ = auVar48._0_2_;
            auVar119 = pmaddwd(local_158,auVar11);
            auVar49._2_2_ = auVar48._8_2_;
            auVar49._0_2_ = auVar25._8_2_;
            auVar49._4_2_ = auVar25._10_2_;
            auVar49._6_2_ = auVar48._10_2_;
            auVar49._8_2_ = auVar25._12_2_;
            auVar49._10_2_ = auVar48._12_2_;
            auVar49._12_2_ = auVar25._14_2_;
            auVar49._14_2_ = auVar48._14_2_;
            auVar121._2_2_ = auVar81._8_2_;
            auVar121._0_2_ = auVar48._8_2_;
            auVar121._4_2_ = auVar48._10_2_;
            auVar121._6_2_ = auVar81._10_2_;
            auVar121._8_2_ = auVar48._12_2_;
            auVar121._10_2_ = auVar81._12_2_;
            auVar121._12_2_ = auVar48._14_2_;
            auVar121._14_2_ = auVar81._14_2_;
            auVar39._0_4_ =
                 auVar38._0_4_ + auVar67._0_4_ + auVar37._0_4_ + auVar47._0_4_ + auVar36._0_4_ +
                 0x40 + auVar55._0_4_ >> 7;
            auVar39._4_4_ =
                 auVar38._4_4_ + auVar67._4_4_ + auVar37._4_4_ + auVar47._4_4_ + auVar36._4_4_ +
                 0x40 + auVar55._4_4_ >> 7;
            auVar39._8_4_ =
                 auVar38._8_4_ + auVar67._8_4_ + auVar37._8_4_ + auVar47._8_4_ + auVar36._8_4_ +
                 0x40 + auVar55._8_4_ >> 7;
            auVar39._12_4_ =
                 auVar38._12_4_ + auVar67._12_4_ + auVar37._12_4_ + auVar47._12_4_ + auVar36._12_4_
                 + 0x40 + auVar55._12_4_ >> 7;
            auVar70._0_4_ =
                 auVar69._0_4_ + auVar115._0_4_ + auVar57._0_4_ + auVar68._0_4_ + auVar56._0_4_ +
                 0x40 + auVar119._0_4_ >> 7;
            auVar70._4_4_ =
                 auVar69._4_4_ + auVar115._4_4_ + auVar57._4_4_ + auVar68._4_4_ + auVar56._4_4_ +
                 0x40 + auVar119._4_4_ >> 7;
            auVar70._8_4_ =
                 auVar69._8_4_ + auVar115._8_4_ + auVar57._8_4_ + auVar68._8_4_ + auVar56._8_4_ +
                 0x40 + auVar119._8_4_ >> 7;
            auVar70._12_4_ =
                 auVar69._12_4_ + auVar115._12_4_ + auVar57._12_4_ + auVar68._12_4_ + auVar56._12_4_
                 + 0x40 + auVar119._12_4_ >> 7;
            if ((long)uVar22 < (long)((ulong)(uint)w - 4)) {
              auVar55 = pmaddwd(local_138,auVar74);
              auVar67 = pmaddwd(auVar78,auVar10);
              auVar56 = pmaddwd(auVar80,auVar66);
              auVar25 = pmaddwd(local_1a8,auVar98);
              auVar57 = pmaddwd(local_148,auVar9);
              auVar36 = pmaddwd(auVar49,auVar11);
              auVar48 = pmaddwd(auVar12,auVar74);
              auVar75 = pmaddwd(auVar75,auVar10);
              auVar38 = pmaddwd(local_1e8,auVar66);
              auVar68 = pmaddwd(auVar27,auVar98);
              auVar37 = pmaddwd(auVar120,auVar9);
              auVar47 = pmaddwd(auVar121,auVar11);
              auVar109._0_4_ =
                   auVar57._0_4_ + auVar25._0_4_ + auVar56._0_4_ + auVar67._0_4_ + auVar55._0_4_ +
                   0x40 + auVar36._0_4_ >> 7;
              auVar109._4_4_ =
                   auVar57._4_4_ + auVar25._4_4_ + auVar56._4_4_ + auVar67._4_4_ + auVar55._4_4_ +
                   0x40 + auVar36._4_4_ >> 7;
              auVar109._8_4_ =
                   auVar57._8_4_ + auVar25._8_4_ + auVar56._8_4_ + auVar67._8_4_ + auVar55._8_4_ +
                   0x40 + auVar36._8_4_ >> 7;
              auVar109._12_4_ =
                   auVar57._12_4_ +
                   auVar25._12_4_ + auVar56._12_4_ + auVar67._12_4_ + auVar55._12_4_ + 0x40 +
                   auVar36._12_4_ >> 7;
              auVar25 = packssdw(auVar39,auVar109);
              auVar76._0_4_ =
                   auVar37._0_4_ + auVar68._0_4_ + auVar38._0_4_ + auVar75._0_4_ + auVar48._0_4_ +
                   0x40 + auVar47._0_4_ >> 7;
              auVar76._4_4_ =
                   auVar37._4_4_ + auVar68._4_4_ + auVar38._4_4_ + auVar75._4_4_ + auVar48._4_4_ +
                   0x40 + auVar47._4_4_ >> 7;
              auVar76._8_4_ =
                   auVar37._8_4_ + auVar68._8_4_ + auVar38._8_4_ + auVar75._8_4_ + auVar48._8_4_ +
                   0x40 + auVar47._8_4_ >> 7;
              auVar76._12_4_ =
                   auVar37._12_4_ +
                   auVar68._12_4_ + auVar38._12_4_ + auVar75._12_4_ + auVar48._12_4_ + 0x40 +
                   auVar47._12_4_ >> 7;
              auVar48 = packssdw(auVar70,auVar76);
              sVar23 = auVar25._0_2_;
              uVar30 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar25._2_2_;
              uVar40 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              sVar23 = auVar25._4_2_;
              uVar41 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar25._6_2_;
              uVar42 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              sVar23 = auVar25._8_2_;
              uVar43 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar25._10_2_;
              uVar44 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              sVar23 = auVar25._12_2_;
              sVar29 = auVar25._14_2_;
              uVar45 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              uVar46 = (ushort)(sStack_16e < sVar29) * sStack_16e |
                       (ushort)(sStack_16e >= sVar29) * sVar29;
              *puVar17 = (-1 < (short)uVar30) * uVar30;
              puVar17[1] = (-1 < (short)uVar40) * uVar40;
              puVar17[2] = (-1 < (short)uVar41) * uVar41;
              puVar17[3] = (-1 < (short)uVar42) * uVar42;
              puVar17[4] = (-1 < (short)uVar43) * uVar43;
              puVar17[5] = (-1 < (short)uVar44) * uVar44;
              puVar17[6] = (-1 < (short)uVar45) * uVar45;
              puVar17[7] = (-1 < (short)uVar46) * uVar46;
              sVar23 = auVar48._0_2_;
              uVar30 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar48._2_2_;
              uVar40 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              sVar23 = auVar48._4_2_;
              uVar41 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar48._6_2_;
              uVar42 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              sVar23 = auVar48._8_2_;
              uVar43 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar48._10_2_;
              uVar44 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              sVar23 = auVar48._12_2_;
              sVar29 = auVar48._14_2_;
              uVar45 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              uVar46 = (ushort)(sStack_16e < sVar29) * sStack_16e |
                       (ushort)(sStack_16e >= sVar29) * sVar29;
              puVar5 = puVar17 + lVar21;
              *puVar5 = (-1 < (short)uVar30) * uVar30;
              puVar5[1] = (-1 < (short)uVar40) * uVar40;
              puVar5[2] = (-1 < (short)uVar41) * uVar41;
              puVar5[3] = (-1 < (short)uVar42) * uVar42;
              puVar5[4] = (-1 < (short)uVar43) * uVar43;
              puVar5[5] = (-1 < (short)uVar44) * uVar44;
              puVar5[6] = (-1 < (short)uVar45) * uVar45;
              puVar5[7] = (-1 < (short)uVar46) * uVar46;
            }
            else {
              auVar25 = packssdw(auVar39,auVar39);
              sVar23 = auVar25._0_2_;
              uVar30 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar25._2_2_;
              uVar40 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              sVar23 = auVar25._4_2_;
              uVar41 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar25._6_2_;
              uVar42 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              uVar31 = CONCAT22((-1 < (short)uVar40) * uVar40,(-1 < (short)uVar30) * uVar30);
              auVar25 = packssdw(auVar70,auVar70);
              sVar23 = auVar25._0_2_;
              uVar30 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar25._2_2_;
              uVar40 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              sVar23 = auVar25._4_2_;
              uVar43 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                       (ushort)(sStack_170 >= sVar23) * sVar23;
              sVar23 = auVar25._6_2_;
              uVar44 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                       (ushort)(sStack_16e >= sVar23) * sVar23;
              uVar65 = CONCAT22((-1 < (short)uVar40) * uVar40,(-1 < (short)uVar30) * uVar30);
              if (w == 4) {
                *(ulong *)puVar17 =
                     CONCAT26((-1 < (short)uVar42) * uVar42,
                              CONCAT24((-1 < (short)uVar41) * uVar41,uVar31));
                *(ulong *)(puVar17 + lVar21) =
                     CONCAT26((-1 < (short)uVar44) * uVar44,
                              CONCAT24((-1 < (short)uVar43) * uVar43,uVar65));
              }
              else {
                *(undefined4 *)puVar17 = uVar31;
                *(undefined4 *)(puVar17 + lVar21) = uVar65;
              }
            }
            lVar19 = lVar19 + 2;
            puVar17 = puVar17 + lVar21 * 2;
            puVar13 = puVar13 + (long)src_stride * 2;
            auVar26 = auVar120;
            auVar32 = auVar105;
            auVar50 = auVar80;
            auVar25 = auVar81;
            auVar80 = local_1a8;
            auVar90 = auVar100;
            auVar100 = local_168;
            auVar105 = auVar77;
            auVar111 = local_208;
            auVar120 = auVar121;
            local_208 = auVar97;
            local_1f8 = auVar79;
            local_1e8 = auVar27;
            local_1a8 = local_148;
            local_168 = auVar51;
            local_148 = auVar49;
            local_138 = auVar78;
          } while (lVar19 < h);
        }
        uVar22 = uVar22 + 8;
        dst = dst + 8;
        lVar20 = lVar20 + 0x10;
        lVar16 = lVar16 + 0x10;
      } while (uVar22 < (uint)w);
    }
  }
  else if (0 < w) {
    piVar6 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)uVar30;
    uVar24 = *(undefined4 *)piVar6;
    local_158._4_4_ = *(undefined4 *)(piVar6 + 2);
    local_168._4_4_ = *(undefined4 *)(piVar6 + 4);
    local_108._4_4_ = *(undefined4 *)(piVar6 + 6);
    auVar25._4_4_ = uVar24;
    auVar25._0_4_ = uVar24;
    auVar25._8_4_ = uVar24;
    auVar25._12_4_ = uVar24;
    local_158._0_4_ = local_158._4_4_;
    local_158._8_4_ = local_158._4_4_;
    local_158._12_4_ = local_158._4_4_;
    local_168._0_4_ = local_168._4_4_;
    local_168._8_4_ = local_168._4_4_;
    local_168._12_4_ = local_168._4_4_;
    local_108._0_4_ = local_108._4_4_;
    local_108._8_4_ = local_108._4_4_;
    local_108._12_4_ = local_108._4_4_;
    lVar20 = (long)dst_stride;
    lVar21 = (long)(src_stride * 8) * 2 + lVar14 * -2;
    lVar16 = (long)(src_stride * 7) * 2 + lVar14 * -2;
    uVar22 = 0;
    do {
      if (0 < h) {
        pauVar7 = (undefined1 (*) [16])(src + (uVar22 - lVar14));
        auVar48 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 5) * 2);
        auVar97 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 6) * 2);
        auVar81 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 3) * 2);
        auVar75 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 4) * 2);
        auVar27 = *(undefined1 (*) [16])(*pauVar7 + (long)src_stride * 2);
        auVar36 = *(undefined1 (*) [16])(*pauVar7 + (long)(src_stride * 2) * 2);
        auVar37 = *pauVar7;
        auVar55._2_2_ = auVar27._8_2_;
        auVar55._0_2_ = auVar37._8_2_;
        auVar55._4_2_ = auVar37._10_2_;
        auVar55._6_2_ = auVar27._10_2_;
        auVar55._8_2_ = auVar37._12_2_;
        auVar55._10_2_ = auVar27._12_2_;
        auVar55._12_2_ = auVar37._14_2_;
        auVar55._14_2_ = auVar27._14_2_;
        auVar68._0_12_ = auVar37._0_12_;
        auVar68._12_2_ = auVar37._6_2_;
        auVar68._14_2_ = auVar27._6_2_;
        auVar77._12_4_ = auVar68._12_4_;
        auVar77._0_10_ = auVar37._0_10_;
        auVar77._10_2_ = auVar27._4_2_;
        auVar69._10_6_ = auVar77._10_6_;
        auVar69._0_8_ = auVar37._0_8_;
        auVar69._8_2_ = auVar37._4_2_;
        auVar38._8_8_ = auVar69._8_8_;
        auVar38._6_2_ = auVar27._2_2_;
        auVar38._4_2_ = auVar37._2_2_;
        auVar38._0_2_ = auVar37._0_2_;
        auVar38._2_2_ = auVar27._0_2_;
        auVar56._2_2_ = auVar36._8_2_;
        auVar56._0_2_ = auVar27._8_2_;
        auVar56._4_2_ = auVar27._10_2_;
        auVar56._6_2_ = auVar36._10_2_;
        auVar56._8_2_ = auVar27._12_2_;
        auVar56._10_2_ = auVar36._12_2_;
        auVar56._12_2_ = auVar27._14_2_;
        auVar56._14_2_ = auVar36._14_2_;
        auVar96._0_12_ = auVar27._0_12_;
        auVar96._12_2_ = auVar27._6_2_;
        auVar96._14_2_ = auVar36._6_2_;
        auVar95._12_4_ = auVar96._12_4_;
        auVar95._0_10_ = auVar27._0_10_;
        auVar95._10_2_ = auVar36._4_2_;
        auVar94._10_6_ = auVar95._10_6_;
        auVar94._0_8_ = auVar27._0_8_;
        auVar94._8_2_ = auVar27._4_2_;
        auVar78._8_8_ = auVar94._8_8_;
        auVar78._6_2_ = auVar36._2_2_;
        auVar78._4_2_ = auVar27._2_2_;
        auVar37._0_2_ = auVar36._0_2_;
        auVar78._2_2_ = auVar37._0_2_;
        auVar78._0_2_ = auVar27._0_2_;
        auVar27._2_2_ = auVar81._8_2_;
        auVar27._0_2_ = auVar36._8_2_;
        auVar27._4_2_ = auVar36._10_2_;
        auVar27._6_2_ = auVar81._10_2_;
        auVar27._8_2_ = auVar36._12_2_;
        auVar27._10_2_ = auVar81._12_2_;
        auVar27._12_2_ = auVar36._14_2_;
        auVar27._14_2_ = auVar81._14_2_;
        auVar79._0_12_ = auVar36._0_12_;
        auVar79._12_2_ = auVar36._6_2_;
        auVar79._14_2_ = auVar81._6_2_;
        auVar115._12_4_ = auVar79._12_4_;
        auVar115._0_10_ = auVar36._0_10_;
        auVar115._10_2_ = auVar81._4_2_;
        auVar119._10_6_ = auVar115._10_6_;
        auVar119._0_8_ = auVar36._0_8_;
        auVar119._8_2_ = auVar36._4_2_;
        auVar37._8_8_ = auVar119._8_8_;
        auVar37._6_2_ = auVar81._2_2_;
        auVar37._4_2_ = auVar36._2_2_;
        auVar37._2_2_ = auVar81._0_2_;
        auVar67._2_2_ = auVar75._8_2_;
        auVar67._0_2_ = auVar81._8_2_;
        auVar67._4_2_ = auVar81._10_2_;
        auVar67._6_2_ = auVar75._10_2_;
        auVar67._8_2_ = auVar81._12_2_;
        auVar67._10_2_ = auVar75._12_2_;
        auVar67._12_2_ = auVar81._14_2_;
        auVar67._14_2_ = auVar75._14_2_;
        auVar73._0_12_ = auVar81._0_12_;
        auVar73._12_2_ = auVar81._6_2_;
        auVar73._14_2_ = auVar75._6_2_;
        auVar72._12_4_ = auVar73._12_4_;
        auVar72._0_10_ = auVar81._0_10_;
        auVar72._10_2_ = auVar75._4_2_;
        auVar71._10_6_ = auVar72._10_6_;
        auVar71._0_8_ = auVar81._0_8_;
        auVar71._8_2_ = auVar81._4_2_;
        auVar47._8_8_ = auVar71._8_8_;
        auVar47._6_2_ = auVar75._2_2_;
        auVar47._4_2_ = auVar81._2_2_;
        auVar36._0_2_ = auVar75._0_2_;
        auVar47._2_2_ = auVar36._0_2_;
        auVar47._0_2_ = auVar81._0_2_;
        auVar57._2_2_ = auVar48._8_2_;
        auVar57._0_2_ = auVar75._8_2_;
        auVar57._4_2_ = auVar75._10_2_;
        auVar57._6_2_ = auVar48._10_2_;
        auVar57._8_2_ = auVar75._12_2_;
        auVar57._10_2_ = auVar48._12_2_;
        auVar57._12_2_ = auVar75._14_2_;
        auVar57._14_2_ = auVar48._14_2_;
        auVar60._0_12_ = auVar75._0_12_;
        auVar60._12_2_ = auVar75._6_2_;
        auVar60._14_2_ = auVar48._6_2_;
        auVar59._12_4_ = auVar60._12_4_;
        auVar59._0_10_ = auVar75._0_10_;
        auVar59._10_2_ = auVar48._4_2_;
        auVar58._10_6_ = auVar59._10_6_;
        auVar58._0_8_ = auVar75._0_8_;
        auVar58._8_2_ = auVar75._4_2_;
        auVar36._8_8_ = auVar58._8_8_;
        auVar36._6_2_ = auVar48._2_2_;
        auVar36._4_2_ = auVar75._2_2_;
        auVar36._2_2_ = auVar48._0_2_;
        auVar75._2_2_ = auVar97._8_2_;
        auVar75._0_2_ = auVar48._8_2_;
        auVar75._4_2_ = auVar48._10_2_;
        auVar75._6_2_ = auVar97._10_2_;
        auVar75._8_2_ = auVar48._12_2_;
        auVar75._10_2_ = auVar97._12_2_;
        auVar75._12_2_ = auVar48._14_2_;
        auVar75._14_2_ = auVar97._14_2_;
        auVar84._0_12_ = auVar48._0_12_;
        auVar84._12_2_ = auVar48._6_2_;
        auVar84._14_2_ = auVar97._6_2_;
        auVar83._12_4_ = auVar84._12_4_;
        auVar83._0_10_ = auVar48._0_10_;
        auVar83._10_2_ = auVar97._4_2_;
        auVar82._10_6_ = auVar83._10_6_;
        auVar82._0_8_ = auVar48._0_8_;
        auVar82._8_2_ = auVar48._4_2_;
        auVar81._8_8_ = auVar82._8_8_;
        auVar81._6_2_ = auVar97._2_2_;
        auVar81._4_2_ = auVar48._2_2_;
        auVar81._2_2_ = auVar97._0_2_;
        auVar81._0_2_ = auVar48._0_2_;
        lVar19 = 0;
        puVar13 = dst;
        puVar17 = src;
        do {
          auVar60 = auVar75;
          auVar69 = auVar47;
          auVar68 = auVar27;
          auVar48 = *(undefined1 (*) [16])((long)puVar17 + lVar16);
          pauVar7 = (undefined1 (*) [16])((long)puVar17 + lVar21);
          auVar64._0_12_ = auVar97._0_12_;
          auVar64._12_2_ = auVar97._6_2_;
          auVar64._14_2_ = auVar48._6_2_;
          auVar63._12_4_ = auVar64._12_4_;
          auVar63._0_10_ = auVar97._0_10_;
          auVar63._10_2_ = auVar48._4_2_;
          auVar62._10_6_ = auVar63._10_6_;
          auVar62._0_8_ = auVar97._0_8_;
          auVar62._8_2_ = auVar97._4_2_;
          auVar61._8_8_ = auVar62._8_8_;
          auVar61._6_2_ = auVar48._2_2_;
          auVar61._4_2_ = auVar97._2_2_;
          auVar61._0_2_ = auVar97._0_2_;
          auVar61._2_2_ = auVar48._0_2_;
          auVar88._0_12_ = auVar48._0_12_;
          auVar88._12_2_ = auVar48._6_2_;
          auVar88._14_2_ = *(undefined2 *)(*pauVar7 + 6);
          auVar87._12_4_ = auVar88._12_4_;
          auVar87._0_10_ = auVar48._0_10_;
          auVar87._10_2_ = *(undefined2 *)(*pauVar7 + 4);
          auVar86._10_6_ = auVar87._10_6_;
          auVar86._0_8_ = auVar48._0_8_;
          auVar86._8_2_ = auVar48._4_2_;
          auVar85._8_8_ = auVar86._8_8_;
          auVar85._6_2_ = *(undefined2 *)(*pauVar7 + 2);
          auVar85._4_2_ = auVar48._2_2_;
          auVar85._2_2_ = *(undefined2 *)*pauVar7;
          auVar85._0_2_ = auVar48._0_2_;
          auVar27 = pmaddwd(auVar38,auVar25);
          auVar47 = pmaddwd(auVar37,local_158);
          auVar38 = pmaddwd(auVar36,local_168);
          auVar77 = pmaddwd(auVar61,local_108);
          auVar115 = pmaddwd(auVar78,auVar25);
          auVar78 = pmaddwd(auVar69,local_158);
          auVar119 = pmaddwd(auVar81,local_168);
          auVar79 = pmaddwd(auVar85,local_108);
          auVar110._2_2_ = auVar48._8_2_;
          auVar110._0_2_ = auVar97._8_2_;
          auVar110._4_2_ = auVar97._10_2_;
          auVar110._6_2_ = auVar48._10_2_;
          auVar110._8_2_ = auVar97._12_2_;
          auVar110._10_2_ = auVar48._12_2_;
          auVar110._12_2_ = auVar97._14_2_;
          auVar110._14_2_ = auVar48._14_2_;
          auVar75._2_2_ = *(undefined2 *)(*pauVar7 + 8);
          auVar75._0_2_ = auVar48._8_2_;
          auVar75._4_2_ = auVar48._10_2_;
          auVar75._6_2_ = *(undefined2 *)(*pauVar7 + 10);
          auVar75._8_2_ = auVar48._12_2_;
          auVar75._10_2_ = *(undefined2 *)(*pauVar7 + 0xc);
          auVar75._12_2_ = auVar48._14_2_;
          auVar75._14_2_ = *(undefined2 *)(*pauVar7 + 0xe);
          auVar48._0_4_ = auVar38._0_4_ + auVar47._0_4_ + auVar27._0_4_ + 0x40 + auVar77._0_4_ >> 7;
          auVar48._4_4_ = auVar38._4_4_ + auVar47._4_4_ + auVar27._4_4_ + 0x40 + auVar77._4_4_ >> 7;
          auVar48._8_4_ = auVar38._8_4_ + auVar47._8_4_ + auVar27._8_4_ + 0x40 + auVar77._8_4_ >> 7;
          auVar48._12_4_ =
               auVar38._12_4_ + auVar47._12_4_ + auVar27._12_4_ + 0x40 + auVar77._12_4_ >> 7;
          auVar97._0_4_ =
               auVar119._0_4_ + auVar78._0_4_ + auVar115._0_4_ + 0x40 + auVar79._0_4_ >> 7;
          auVar97._4_4_ =
               auVar119._4_4_ + auVar78._4_4_ + auVar115._4_4_ + 0x40 + auVar79._4_4_ >> 7;
          auVar97._8_4_ =
               auVar119._8_4_ + auVar78._8_4_ + auVar115._8_4_ + 0x40 + auVar79._8_4_ >> 7;
          auVar97._12_4_ =
               auVar119._12_4_ + auVar78._12_4_ + auVar115._12_4_ + 0x40 + auVar79._12_4_ >> 7;
          if ((long)uVar22 < (long)((ulong)(uint)w - 4)) {
            auVar55 = pmaddwd(auVar55,auVar25);
            auVar27 = pmaddwd(auVar68,local_158);
            auVar77 = pmaddwd(auVar57,local_168);
            auVar38 = pmaddwd(auVar110,local_108);
            auVar56 = pmaddwd(auVar56,auVar25);
            auVar47 = pmaddwd(auVar67,local_158);
            auVar79 = pmaddwd(auVar60,local_168);
            auVar78 = pmaddwd(auVar75,local_108);
            auVar99._0_4_ =
                 auVar77._0_4_ + auVar27._0_4_ + auVar55._0_4_ + 0x40 + auVar38._0_4_ >> 7;
            auVar99._4_4_ =
                 auVar77._4_4_ + auVar27._4_4_ + auVar55._4_4_ + 0x40 + auVar38._4_4_ >> 7;
            auVar99._8_4_ =
                 auVar77._8_4_ + auVar27._8_4_ + auVar55._8_4_ + 0x40 + auVar38._8_4_ >> 7;
            auVar99._12_4_ =
                 auVar77._12_4_ + auVar27._12_4_ + auVar55._12_4_ + 0x40 + auVar38._12_4_ >> 7;
            auVar48 = packssdw(auVar48,auVar99);
            auVar104._0_4_ =
                 auVar79._0_4_ + auVar47._0_4_ + auVar56._0_4_ + 0x40 + auVar78._0_4_ >> 7;
            auVar104._4_4_ =
                 auVar79._4_4_ + auVar47._4_4_ + auVar56._4_4_ + 0x40 + auVar78._4_4_ >> 7;
            auVar104._8_4_ =
                 auVar79._8_4_ + auVar47._8_4_ + auVar56._8_4_ + 0x40 + auVar78._8_4_ >> 7;
            auVar104._12_4_ =
                 auVar79._12_4_ + auVar47._12_4_ + auVar56._12_4_ + 0x40 + auVar78._12_4_ >> 7;
            auVar97 = packssdw(auVar97,auVar104);
            sVar23 = auVar48._0_2_;
            uVar30 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar48._2_2_;
            uVar40 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            sVar23 = auVar48._4_2_;
            uVar41 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar48._6_2_;
            uVar42 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            sVar23 = auVar48._8_2_;
            uVar43 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar48._10_2_;
            uVar44 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            sVar23 = auVar48._12_2_;
            sVar29 = auVar48._14_2_;
            uVar45 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            uVar46 = (ushort)(sStack_16e < sVar29) * sStack_16e |
                     (ushort)(sStack_16e >= sVar29) * sVar29;
            *puVar13 = (-1 < (short)uVar30) * uVar30;
            puVar13[1] = (-1 < (short)uVar40) * uVar40;
            puVar13[2] = (-1 < (short)uVar41) * uVar41;
            puVar13[3] = (-1 < (short)uVar42) * uVar42;
            puVar13[4] = (-1 < (short)uVar43) * uVar43;
            puVar13[5] = (-1 < (short)uVar44) * uVar44;
            puVar13[6] = (-1 < (short)uVar45) * uVar45;
            puVar13[7] = (-1 < (short)uVar46) * uVar46;
            sVar23 = auVar97._0_2_;
            uVar30 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar97._2_2_;
            uVar40 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            sVar23 = auVar97._4_2_;
            uVar41 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar97._6_2_;
            uVar42 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            sVar23 = auVar97._8_2_;
            uVar43 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar97._10_2_;
            uVar44 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            sVar23 = auVar97._12_2_;
            sVar29 = auVar97._14_2_;
            uVar45 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            uVar46 = (ushort)(sStack_16e < sVar29) * sStack_16e |
                     (ushort)(sStack_16e >= sVar29) * sVar29;
            puVar5 = puVar13 + lVar20;
            *puVar5 = (-1 < (short)uVar30) * uVar30;
            puVar5[1] = (-1 < (short)uVar40) * uVar40;
            puVar5[2] = (-1 < (short)uVar41) * uVar41;
            puVar5[3] = (-1 < (short)uVar42) * uVar42;
            puVar5[4] = (-1 < (short)uVar43) * uVar43;
            puVar5[5] = (-1 < (short)uVar44) * uVar44;
            puVar5[6] = (-1 < (short)uVar45) * uVar45;
            puVar5[7] = (-1 < (short)uVar46) * uVar46;
          }
          else {
            auVar48 = packssdw(auVar48,auVar48);
            sVar23 = auVar48._0_2_;
            uVar30 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar48._2_2_;
            uVar40 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            sVar23 = auVar48._4_2_;
            uVar41 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar48._6_2_;
            uVar42 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            uVar24 = CONCAT22((-1 < (short)uVar40) * uVar40,(-1 < (short)uVar30) * uVar30);
            auVar48 = packssdw(auVar97,auVar97);
            sVar23 = auVar48._0_2_;
            uVar30 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar48._2_2_;
            uVar40 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            sVar23 = auVar48._4_2_;
            uVar43 = (ushort)(sStack_170 < sVar23) * sStack_170 |
                     (ushort)(sStack_170 >= sVar23) * sVar23;
            sVar23 = auVar48._6_2_;
            uVar44 = (ushort)(sStack_16e < sVar23) * sStack_16e |
                     (ushort)(sStack_16e >= sVar23) * sVar23;
            uVar89 = CONCAT22((-1 < (short)uVar40) * uVar40,(-1 < (short)uVar30) * uVar30);
            if (w == 4) {
              *(ulong *)puVar13 =
                   CONCAT26((-1 < (short)uVar42) * uVar42,
                            CONCAT24((-1 < (short)uVar41) * uVar41,uVar24));
              *(ulong *)(puVar13 + lVar20) =
                   CONCAT26((-1 < (short)uVar44) * uVar44,
                            CONCAT24((-1 < (short)uVar43) * uVar43,uVar89));
            }
            else {
              *(undefined4 *)puVar13 = uVar24;
              *(undefined4 *)(puVar13 + lVar20) = uVar89;
            }
          }
          auVar97 = *pauVar7;
          lVar19 = lVar19 + 2;
          puVar13 = puVar13 + lVar20 * 2;
          puVar17 = puVar17 + (long)src_stride * 2;
          auVar38 = auVar37;
          auVar37 = auVar36;
          auVar27 = auVar57;
          auVar36 = auVar61;
          auVar47 = auVar81;
          auVar81 = auVar85;
          auVar78 = auVar69;
          auVar55 = auVar68;
          auVar56 = auVar67;
          auVar57 = auVar110;
          auVar67 = auVar60;
        } while (lVar19 < h);
      }
      uVar22 = uVar22 + 8;
      dst = dst + 8;
      lVar21 = lVar21 + 0x10;
      lVar16 = lVar16 + 0x10;
    } while (uVar22 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_ssse3(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_y_qn, int bd) {
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();
  if (filter_params_y->taps == 12) {
    __m128i s[24], coeffs_y[6];

    prepare_coeffs_12tap(filter_params_y, subpel_y_qn, coeffs_y);

    for (j = 0; j < w; j += 8) {
      const uint16_t *data = &src_ptr[j];
      /* Vertical filter */
      __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
      __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
      __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
      __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
      __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));
      __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
      __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));
      __m128i s9 = _mm_loadu_si128((__m128i *)(data + 9 * src_stride));
      __m128i s10 = _mm_loadu_si128((__m128i *)(data + 10 * src_stride));

      s[0] = _mm_unpacklo_epi16(s0, s1);
      s[1] = _mm_unpacklo_epi16(s2, s3);
      s[2] = _mm_unpacklo_epi16(s4, s5);
      s[3] = _mm_unpacklo_epi16(s6, s7);
      s[4] = _mm_unpacklo_epi16(s8, s9);

      s[6] = _mm_unpackhi_epi16(s0, s1);
      s[7] = _mm_unpackhi_epi16(s2, s3);
      s[8] = _mm_unpackhi_epi16(s4, s5);
      s[9] = _mm_unpackhi_epi16(s6, s7);
      s[10] = _mm_unpackhi_epi16(s8, s9);

      s[12] = _mm_unpacklo_epi16(s1, s2);
      s[13] = _mm_unpacklo_epi16(s3, s4);
      s[14] = _mm_unpacklo_epi16(s5, s6);
      s[15] = _mm_unpacklo_epi16(s7, s8);
      s[16] = _mm_unpacklo_epi16(s9, s10);

      s[18] = _mm_unpackhi_epi16(s1, s2);
      s[19] = _mm_unpackhi_epi16(s3, s4);
      s[20] = _mm_unpackhi_epi16(s5, s6);
      s[21] = _mm_unpackhi_epi16(s7, s8);
      s[22] = _mm_unpackhi_epi16(s9, s10);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        __m128i s11 = _mm_loadu_si128((__m128i *)(data + 11 * src_stride));
        __m128i s12 = _mm_loadu_si128((__m128i *)(data + 12 * src_stride));

        s[5] = _mm_unpacklo_epi16(s10, s11);
        s[11] = _mm_unpackhi_epi16(s10, s11);

        s[17] = _mm_unpacklo_epi16(s11, s12);
        s[23] = _mm_unpackhi_epi16(s11, s12);

        const __m128i res_a0 = convolve_12tap(s, coeffs_y);
        __m128i res_a_round0 = _mm_sra_epi32(
            _mm_add_epi32(res_a0, round_const_bits), round_shift_bits);

        const __m128i res_a1 = convolve_12tap(s + 12, coeffs_y);
        __m128i res_a_round1 = _mm_sra_epi32(
            _mm_add_epi32(res_a1, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m128i res_b0 = convolve_12tap(s + 6, coeffs_y);
          __m128i res_b_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_b0, round_const_bits), round_shift_bits);

          const __m128i res_b1 = convolve_12tap(s + 18, coeffs_y);
          __m128i res_b_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_b1, round_const_bits), round_shift_bits);

          __m128i res_16bit0 = _mm_packs_epi32(res_a_round0, res_b_round0);
          res_16bit0 = _mm_min_epi16(res_16bit0, clip_pixel);
          res_16bit0 = _mm_max_epi16(res_16bit0, zero);

          __m128i res_16bit1 = _mm_packs_epi32(res_a_round1, res_b_round1);
          res_16bit1 = _mm_min_epi16(res_16bit1, clip_pixel);
          res_16bit1 = _mm_max_epi16(res_16bit1, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res_16bit0);
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           res_16bit1);
        } else if (w == 4) {
          res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
          res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
          res_a_round0 = _mm_max_epi16(res_a_round0, zero);

          res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
          res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
          res_a_round1 = _mm_max_epi16(res_a_round1, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_a_round0);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           res_a_round1);
        } else {
          res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
          res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
          res_a_round0 = _mm_max_epi16(res_a_round0, zero);

          res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
          res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
          res_a_round1 = _mm_max_epi16(res_a_round1, zero);

          *((int *)(&dst[i * dst_stride + j])) =
              _mm_cvtsi128_si32(res_a_round0);

          *((int *)(&dst[i * dst_stride + j + dst_stride])) =
              _mm_cvtsi128_si32(res_a_round1);
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];
        s[3] = s[4];
        s[4] = s[5];

        s[6] = s[7];
        s[7] = s[8];
        s[8] = s[9];
        s[9] = s[10];
        s[10] = s[11];

        s[12] = s[13];
        s[13] = s[14];
        s[14] = s[15];
        s[15] = s[16];
        s[16] = s[17];

        s[18] = s[19];
        s[19] = s[20];
        s[20] = s[21];
        s[21] = s[22];
        s[22] = s[23];

        s10 = s12;
      }
    }
  } else {
    __m128i s[16], coeffs_y[4];

    prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

    for (j = 0; j < w; j += 8) {
      const uint16_t *data = &src_ptr[j];
      /* Vertical filter */
      {
        __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
        __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
        __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
        __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
        __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
        __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
        __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));

        s[0] = _mm_unpacklo_epi16(s0, s1);
        s[1] = _mm_unpacklo_epi16(s2, s3);
        s[2] = _mm_unpacklo_epi16(s4, s5);

        s[4] = _mm_unpackhi_epi16(s0, s1);
        s[5] = _mm_unpackhi_epi16(s2, s3);
        s[6] = _mm_unpackhi_epi16(s4, s5);

        s[0 + 8] = _mm_unpacklo_epi16(s1, s2);
        s[1 + 8] = _mm_unpacklo_epi16(s3, s4);
        s[2 + 8] = _mm_unpacklo_epi16(s5, s6);

        s[4 + 8] = _mm_unpackhi_epi16(s1, s2);
        s[5 + 8] = _mm_unpackhi_epi16(s3, s4);
        s[6 + 8] = _mm_unpackhi_epi16(s5, s6);

        for (i = 0; i < h; i += 2) {
          data = &src_ptr[i * src_stride + j];

          __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
          __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));

          s[3] = _mm_unpacklo_epi16(s6, s7);
          s[7] = _mm_unpackhi_epi16(s6, s7);

          s[3 + 8] = _mm_unpacklo_epi16(s7, s8);
          s[7 + 8] = _mm_unpackhi_epi16(s7, s8);

          const __m128i res_a0 = convolve(s, coeffs_y);
          __m128i res_a_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_a0, round_const_bits), round_shift_bits);

          const __m128i res_a1 = convolve(s + 8, coeffs_y);
          __m128i res_a_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_a1, round_const_bits), round_shift_bits);

          if (w - j > 4) {
            const __m128i res_b0 = convolve(s + 4, coeffs_y);
            __m128i res_b_round0 = _mm_sra_epi32(
                _mm_add_epi32(res_b0, round_const_bits), round_shift_bits);

            const __m128i res_b1 = convolve(s + 4 + 8, coeffs_y);
            __m128i res_b_round1 = _mm_sra_epi32(
                _mm_add_epi32(res_b1, round_const_bits), round_shift_bits);

            __m128i res_16bit0 = _mm_packs_epi32(res_a_round0, res_b_round0);
            res_16bit0 = _mm_min_epi16(res_16bit0, clip_pixel);
            res_16bit0 = _mm_max_epi16(res_16bit0, zero);

            __m128i res_16bit1 = _mm_packs_epi32(res_a_round1, res_b_round1);
            res_16bit1 = _mm_min_epi16(res_16bit1, clip_pixel);
            res_16bit1 = _mm_max_epi16(res_16bit1, zero);

            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res_16bit0);
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_16bit1);
          } else if (w == 4) {
            res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
            res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
            res_a_round0 = _mm_max_epi16(res_a_round0, zero);

            res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
            res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
            res_a_round1 = _mm_max_epi16(res_a_round1, zero);

            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_a_round0);
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_a_round1);
          } else {
            res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
            res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
            res_a_round0 = _mm_max_epi16(res_a_round0, zero);

            res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
            res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
            res_a_round1 = _mm_max_epi16(res_a_round1, zero);

            *((int *)(&dst[i * dst_stride + j])) =
                _mm_cvtsi128_si32(res_a_round0);

            *((int *)(&dst[i * dst_stride + j + dst_stride])) =
                _mm_cvtsi128_si32(res_a_round1);
          }

          s[0] = s[1];
          s[1] = s[2];
          s[2] = s[3];

          s[4] = s[5];
          s[5] = s[6];
          s[6] = s[7];

          s[0 + 8] = s[1 + 8];
          s[1 + 8] = s[2 + 8];
          s[2 + 8] = s[3 + 8];

          s[4 + 8] = s[5 + 8];
          s[5 + 8] = s[6 + 8];
          s[6 + 8] = s[7 + 8];

          s6 = s8;
        }
      }
    }
  }
}